

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Psr_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  Psr_Ntk_t *pPVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  FILE *pFile;
  int i;
  Psr_Ntk_t *pNtk;
  Vec_Ptr_t *vPrs_local;
  char *pFileName_local;
  
  pPVar2 = Psr_ManRoot(vPrs);
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    pcVar3 = Psr_NtkStr(pPVar2,pPVar2->iModuleName);
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar3,pcVar4);
    for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize(vPrs), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      pPVar2 = (Psr_Ntk_t *)Vec_PtrEntry(vPrs,pFile._4_4_);
      Psr_ManWriteVerilogNtk((FILE *)__stream,pPVar2);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Psr_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Psr_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_ManWriteVerilogNtk( pFile, pNtk );
    fclose( pFile );
}